

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O0

QString * QString::sliced_helper(QString *str,qsizetype pos,qsizetype n)

{
  char16_t *pcVar1;
  long in_RCX;
  QString *in_RDI;
  long in_FS_OFFSET;
  DataPointer d;
  DataPointer *in_stack_ffffffffffffff68;
  QArrayDataPointer<char16_t> *in_stack_ffffffffffffff70;
  char16_t *in_stack_ffffffffffffff78;
  QArrayDataPointer<char16_t> *this;
  QArrayDataPointer<char16_t> *in_stack_ffffffffffffff98;
  QArrayDataPointer<char16_t> local_38 [2];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_RCX == 0) {
    QArrayDataPointer<char16_t>::fromRawData
              (in_stack_ffffffffffffff78,(qsizetype)in_stack_ffffffffffffff70);
    QString((QString *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(in_stack_ffffffffffffff70);
  }
  else {
    local_38[0].d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_38[0].ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    local_38[0].size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    this = local_38;
    QArrayDataPointer<char16_t>::sliced
              (in_stack_ffffffffffffff98,(qsizetype)in_RDI,(qsizetype)in_RDI);
    pcVar1 = QArrayDataPointer<char16_t>::data(this);
    pcVar1[in_RCX] = L'\0';
    QString((QString *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(in_stack_ffffffffffffff70);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QString QString::sliced_helper(QString &str, qsizetype pos, qsizetype n)
{
    if (n == 0)
        return QString(DataPointer::fromRawData(&_empty, 0));
    DataPointer d = std::move(str.d).sliced(pos, n);
    d.data()[n] = 0;
    return QString(std::move(d));
}